

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter_impl.h
# Opt level: O2

void __thiscall
spdlog::details::aggregate_formatter::~aggregate_formatter(aggregate_formatter *this)

{
  std::__cxx11::string::~string((string *)&this->_str);
  operator_delete(this);
  return;
}

Assistant:

class aggregate_formatter SPDLOG_FINAL : public flag_formatter
{
public:
    aggregate_formatter() = default;

    void add_ch(char ch)
    {
        _str += ch;
    }
    void format(details::log_msg &msg, const std::tm &) override
    {
        msg.formatted << _str;
    }

private:
    std::string _str;
}